

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

string * showVector_abi_cxx11_(string *__return_storage_ptr__,vector<int,_std::allocator<int>_> *v)

{
  pointer piVar1;
  uint uVar2;
  ulong uVar3;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar3) break;
    if (uVar3 != 0) {
      std::operator<<(local_1a0," ");
      piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    }
    std::ostream::operator<<((ostream *)local_1a0,piVar1[uVar3]);
    uVar2 = uVar2 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string showVector(const std::vector<int>& v) {
	std::stringstream ss;
	for (unsigned int i = 0; i < v.size(); i++) {
		if (i > 0) {
			ss << " ";
		}
		ss << v[i];
	}
	return ss.str();
}